

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

string * __thiscall
flatbuffers::java::GenMethod_abi_cxx11_(string *__return_storage_ptr__,java *this,FieldDef *field)

{
  char *pcVar1;
  string local_30;
  
  if (*(int *)(this + 0x90) - 1U < 0xc) {
    GenTypeBasic_abi_cxx11_(&local_30,this + 0x90,(Type *)field);
    MakeCamel(__return_storage_ptr__,&local_30,true);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    if (*(int *)(this + 0x90) == 0xf) {
      pcVar1 = "Offset";
      if (*(char *)(*(long *)(this + 0x98) + 0xd8) != '\0') {
        pcVar1 = "Struct";
      }
    }
    else {
      pcVar1 = "Offset";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenMethod(const FieldDef &field) {
  return IsScalar(field.value.type.base_type)
    ? MakeCamel(GenTypeBasic(field.value.type))
    : (IsStruct(field.value.type) ? "Struct" : "Offset");
}